

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O0

_Bool al_set_shader_sampler(char *name,ALLEGRO_BITMAP *bitmap,int unit)

{
  ALLEGRO_SHADER *pAVar1;
  ALLEGRO_BITMAP *pAVar2;
  int in_EDX;
  ALLEGRO_BITMAP *in_RSI;
  char *in_RDI;
  ALLEGRO_SHADER *shader;
  ALLEGRO_BITMAP *bmp;
  _Bool local_1;
  
  pAVar2 = al_get_target_bitmap();
  if (pAVar2 == (ALLEGRO_BITMAP *)0x0) {
    local_1 = false;
  }
  else {
    pAVar1 = pAVar2->shader;
    if (pAVar1 == (ALLEGRO_SHADER *)0x0) {
      local_1 = false;
    }
    else {
      local_1 = (*pAVar1->vt->set_shader_sampler)(pAVar1,in_RDI,in_RSI,in_EDX);
    }
  }
  return local_1;
}

Assistant:

bool al_set_shader_sampler(const char *name,
   ALLEGRO_BITMAP *bitmap, int unit)
{
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_SHADER *shader;

   if ((bmp = al_get_target_bitmap()) != NULL) {
      if ((shader = bmp->shader) != NULL) {
         return shader->vt->set_shader_sampler(shader, name, bitmap, unit);
      }
      else {
         return false;
      }
   }
   else {
      return false;
   }
}